

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fltnode.c
# Opt level: O0

int callback(void *sys,void *user)

{
  uint uVar1;
  size_t sVar2;
  prf_nodeinfo_t *ppVar3;
  bfile_t *in_RSI;
  long in_RDI;
  int pos;
  long fpos;
  bfile_t *file;
  prf_nodeinfo_t *info;
  prf_node_t *node;
  undefined4 in_stack_ffffffffffffffcc;
  
  sVar2 = bf_get_position(in_RSI);
  if (position < (long)sVar2) {
    ppVar3 = prf_nodeinfo_get((uint16_t)((uint)in_stack_ffffffffffffffcc >> 0x10));
    printf("enclosing node: \"%s\" (opcode=%d)\n",ppVar3->name,(ulong)ppVar3->opcode);
    uVar1 = (int)sVar2 - (uint)*(ushort *)(in_RDI + 2);
    printf("    position: %d (+%ld) [node size %d]\n",(ulong)uVar1,position - (int)uVar1,
           (ulong)*(ushort *)(in_RDI + 2));
    exit(0);
  }
  return 1;
}

Assistant:

int
callback(
  void * sys,
  void * user )
{
  prf_node_t * node;
  prf_nodeinfo_t * info;
  bfile_t * file;
  long fpos;

  node = (prf_node_t *) sys;
  file = (bfile_t *) user;

  fpos = bf_get_position( file );
  if ( fpos > position ) {
    int pos;
    info = prf_nodeinfo_get( node->opcode );
    assert( info != NULL );
    printf( "enclosing node: \"%s\" (opcode=%d)\n", info->name,
       info->opcode );
    pos = fpos - node->length;
    printf( "    position: %d (+%ld) [node size %d]\n",
        pos, position - pos, node->length );
    exit( 0 ); /* model load can't be broken with PRF_TRAV_EXIT */
  }
  return PRF_TRAV_CONTINUE;
}